

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Literal * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::extendForPacking
          (Literal *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,Literal *value
          ,Field *field,bool signed_)

{
  uint uVar1;
  anon_union_16_5_9943fe1e_for_Literal_0 local_30;
  undefined8 local_20;
  
  if ((field->type).id != 2) goto LAB_00198e95;
  if ((value->type).id != 2) {
    __assert_fail("type == Type::i32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                  ,0x118,"int32_t wasm::Literal::geti32() const");
  }
  uVar1 = (value->field_0).i32;
  if (field->packedType == i16) {
    if (0xffff < uVar1) {
      __assert_fail("c == (c & 0xffff)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                    ,0x7cd,
                    "Literal wasm::ExpressionRunner<wasm::ModuleRunner>::extendForPacking(Literal, const Field &, bool) [SubType = wasm::ModuleRunner]"
                   );
    }
    if (!signed_) goto LAB_00198e95;
    local_30.i32 = (int32_t)(short)uVar1;
    local_20 = 2;
    ::wasm::Literal::operator=(value,(Literal *)&local_30.func);
  }
  else {
    if (field->packedType != i8) goto LAB_00198e95;
    if (0xff < uVar1) {
      __assert_fail("c == (c & 0xff)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                    ,0x7c8,
                    "Literal wasm::ExpressionRunner<wasm::ModuleRunner>::extendForPacking(Literal, const Field &, bool) [SubType = wasm::ModuleRunner]"
                   );
    }
    if (!signed_) goto LAB_00198e95;
    local_30.i32 = (int32_t)(char)uVar1;
    local_20 = 2;
    ::wasm::Literal::operator=(value,(Literal *)&local_30.func);
  }
  ::wasm::Literal::~Literal((Literal *)&local_30.func);
LAB_00198e95:
  ::wasm::Literal::Literal(__return_storage_ptr__,value);
  return __return_storage_ptr__;
}

Assistant:

Literal extendForPacking(Literal value, const Field& field, bool signed_) {
    if (field.type == Type::i32) {
      int32_t c = value.geti32();
      if (field.packedType == Field::i8) {
        // The stored value should already be truncated.
        assert(c == (c & 0xff));
        if (signed_) {
          value = Literal((c << 24) >> 24);
        }
      } else if (field.packedType == Field::i16) {
        assert(c == (c & 0xffff));
        if (signed_) {
          value = Literal((c << 16) >> 16);
        }
      }
    }
    return value;
  }